

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::OurReader::readObject(OurReader *this,Token *tokenStart)

{
  bool bVar1;
  Value *pVVar2;
  ulong uVar3;
  long in_RSI;
  long in_RDI;
  bool finalizeTokenOk;
  Token comma;
  bool ok;
  Value *value;
  string msg;
  Token colon;
  Value numberName;
  bool initialTokenOk;
  Value init;
  string name;
  Token tokenName;
  undefined4 in_stack_fffffffffffffd78;
  TokenType in_stack_fffffffffffffd7c;
  undefined7 in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd87;
  Value *in_stack_fffffffffffffd88;
  string *message;
  undefined5 in_stack_fffffffffffffd90;
  undefined1 in_stack_fffffffffffffd95;
  undefined1 in_stack_fffffffffffffd96;
  undefined1 in_stack_fffffffffffffd97;
  undefined8 in_stack_fffffffffffffd98;
  allocator *paVar4;
  undefined5 in_stack_fffffffffffffda0;
  undefined1 in_stack_fffffffffffffda5;
  undefined1 in_stack_fffffffffffffda6;
  undefined1 in_stack_fffffffffffffda7;
  Value *in_stack_fffffffffffffdb0;
  allocator *in_stack_fffffffffffffdc8;
  bool local_21a;
  undefined1 local_1f9 [39];
  bool local_1d2;
  allocator local_1d1;
  string local_1d0 [24];
  string *in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  OurReader *in_stack_fffffffffffffe58;
  Token *in_stack_fffffffffffffe60;
  undefined7 in_stack_fffffffffffffe68;
  byte in_stack_fffffffffffffe6f;
  string local_180 [32];
  string local_160 [39];
  allocator local_139;
  string local_138 [39];
  allocator local_111;
  string local_110 [32];
  int local_f0;
  OurReader *in_stack_ffffffffffffff18;
  string local_d8 [76];
  uint local_8c;
  bool local_85;
  Value *in_stack_ffffffffffffff98;
  string local_50 [32];
  int local_30;
  long local_18;
  byte local_1;
  
  local_18 = in_RSI;
  std::__cxx11::string::string(local_50);
  Value::Value((Value *)CONCAT17(in_stack_fffffffffffffd97,
                                 CONCAT16(in_stack_fffffffffffffd96,
                                          CONCAT15(in_stack_fffffffffffffd95,
                                                   in_stack_fffffffffffffd90))),
               (ValueType)((ulong)in_stack_fffffffffffffd88 >> 0x20));
  currentValue((OurReader *)0x148a45);
  Value::swapPayload((Value *)CONCAT17(in_stack_fffffffffffffd97,
                                       CONCAT16(in_stack_fffffffffffffd96,
                                                CONCAT15(in_stack_fffffffffffffd95,
                                                         in_stack_fffffffffffffd90))),
                     in_stack_fffffffffffffd88);
  pVVar2 = currentValue((OurReader *)0x148a6d);
  Value::setOffsetStart(pVVar2,*(long *)(local_18 + 8) - *(long *)(in_RDI + 0xc0));
  while (bVar1 = readToken((OurReader *)
                           CONCAT17(in_stack_fffffffffffffd97,
                                    CONCAT16(in_stack_fffffffffffffd96,
                                             CONCAT15(in_stack_fffffffffffffd95,
                                                      in_stack_fffffffffffffd90))),
                           (Token *)in_stack_fffffffffffffd88), bVar1) {
    local_85 = true;
    while( true ) {
      local_21a = false;
      if (local_30 == 0xc) {
        local_21a = local_85;
      }
      if (local_21a == false) break;
      local_85 = readToken((OurReader *)
                           CONCAT17(in_stack_fffffffffffffd97,
                                    CONCAT16(in_stack_fffffffffffffd96,
                                             CONCAT15(in_stack_fffffffffffffd95,
                                                      in_stack_fffffffffffffd90))),
                           (Token *)in_stack_fffffffffffffd88);
    }
    if (local_85 == false) break;
    if ((local_30 == 2) && (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) != 0)) {
      local_1 = 1;
      local_8c = 1;
      goto LAB_00149377;
    }
    std::__cxx11::string::operator=(local_50,"");
    if (local_30 == 5) {
      bVar1 = decodeString(in_stack_fffffffffffffe58,
                           (Token *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                           in_stack_fffffffffffffe48);
      if (!bVar1) {
        local_1 = recoverFromError((OurReader *)
                                   CONCAT17(in_stack_fffffffffffffda7,
                                            CONCAT16(in_stack_fffffffffffffda6,
                                                     CONCAT15(in_stack_fffffffffffffda5,
                                                              in_stack_fffffffffffffda0))),
                                   (TokenType)((ulong)in_stack_fffffffffffffd98 >> 0x20));
        local_8c = 1;
        goto LAB_00149377;
      }
    }
    else {
      if ((local_30 != 6) || ((*(byte *)(in_RDI + 0x10f) & 1) == 0)) break;
      Value::Value((Value *)CONCAT17(in_stack_fffffffffffffd97,
                                     CONCAT16(in_stack_fffffffffffffd96,
                                              CONCAT15(in_stack_fffffffffffffd95,
                                                       in_stack_fffffffffffffd90))),
                   (ValueType)((ulong)in_stack_fffffffffffffd88 >> 0x20));
      bVar1 = decodeNumber((OurReader *)
                           CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
                           in_stack_fffffffffffffe60,(Value *)in_stack_fffffffffffffe58);
      if (bVar1) {
        Value::asString_abi_cxx11_(in_stack_ffffffffffffff98);
        std::__cxx11::string::operator=(local_50,local_d8);
        std::__cxx11::string::~string(local_d8);
      }
      else {
        local_1 = recoverFromError((OurReader *)
                                   CONCAT17(in_stack_fffffffffffffda7,
                                            CONCAT16(in_stack_fffffffffffffda6,
                                                     CONCAT15(in_stack_fffffffffffffda5,
                                                              in_stack_fffffffffffffda0))),
                                   (TokenType)((ulong)in_stack_fffffffffffffd98 >> 0x20));
      }
      local_8c = (uint)!bVar1;
      Value::~Value(in_stack_fffffffffffffdb0);
      if (local_8c != 0) goto LAB_00149377;
    }
    bVar1 = readToken((OurReader *)
                      CONCAT17(in_stack_fffffffffffffd97,
                               CONCAT16(in_stack_fffffffffffffd96,
                                        CONCAT15(in_stack_fffffffffffffd95,in_stack_fffffffffffffd90
                                                ))),(Token *)in_stack_fffffffffffffd88);
    if ((!bVar1) || (local_f0 != 0xb)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_110,"Missing \':\' after object member name",&local_111);
      local_1 = addErrorAndRecover((OurReader *)
                                   CONCAT17(in_stack_fffffffffffffd97,
                                            CONCAT16(in_stack_fffffffffffffd96,
                                                     CONCAT15(in_stack_fffffffffffffd95,
                                                              in_stack_fffffffffffffd90))),
                                   (string *)in_stack_fffffffffffffd88,
                                   (Token *)CONCAT17(in_stack_fffffffffffffd87,
                                                     in_stack_fffffffffffffd80),
                                   in_stack_fffffffffffffd7c);
      std::__cxx11::string::~string(local_110);
      std::allocator<char>::~allocator((allocator<char> *)&local_111);
      local_8c = 1;
      goto LAB_00149377;
    }
    uVar3 = std::__cxx11::string::length();
    if (0x3fffffff < uVar3) {
      in_stack_fffffffffffffdc8 = &local_139;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_138,"keylength >= 2^30",in_stack_fffffffffffffdc8);
      throwRuntimeError((string *)
                        CONCAT17(in_stack_fffffffffffffd97,
                                 CONCAT16(in_stack_fffffffffffffd96,
                                          CONCAT15(in_stack_fffffffffffffd95,
                                                   in_stack_fffffffffffffd90))));
      std::__cxx11::string::~string(local_138);
      std::allocator<char>::~allocator((allocator<char> *)&local_139);
    }
    if ((*(byte *)(in_RDI + 0x112) & 1) != 0) {
      pVVar2 = currentValue((OurReader *)0x148f24);
      bVar1 = Value::isMember((Value *)CONCAT17(in_stack_fffffffffffffd97,
                                                CONCAT16(in_stack_fffffffffffffd96,
                                                         CONCAT15(in_stack_fffffffffffffd95,
                                                                  in_stack_fffffffffffffd90))),
                              (string *)in_stack_fffffffffffffd88);
      if (bVar1) {
        std::operator+((char *)in_stack_fffffffffffffdc8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pVVar2);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffd88,
                       (char *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
        std::__cxx11::string::~string(local_180);
        local_1 = addErrorAndRecover((OurReader *)
                                     CONCAT17(in_stack_fffffffffffffd97,
                                              CONCAT16(in_stack_fffffffffffffd96,
                                                       CONCAT15(in_stack_fffffffffffffd95,
                                                                in_stack_fffffffffffffd90))),
                                     (string *)in_stack_fffffffffffffd88,
                                     (Token *)CONCAT17(in_stack_fffffffffffffd87,
                                                       in_stack_fffffffffffffd80),
                                     in_stack_fffffffffffffd7c);
        local_8c = 1;
        std::__cxx11::string::~string(local_160);
        goto LAB_00149377;
      }
    }
    in_stack_fffffffffffffdb0 = currentValue((OurReader *)0x149044);
    Value::operator[]((Value *)CONCAT17(in_stack_fffffffffffffd97,
                                        CONCAT16(in_stack_fffffffffffffd96,
                                                 CONCAT15(in_stack_fffffffffffffd95,
                                                          in_stack_fffffffffffffd90))),
                      (string *)in_stack_fffffffffffffd88);
    std::stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_>::push
              ((stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_> *)
               CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
               (value_type *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    in_stack_fffffffffffffda7 = readValue(in_stack_ffffffffffffff18);
    in_stack_fffffffffffffe6f = in_stack_fffffffffffffda7;
    std::stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_>::pop
              ((stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_> *)
               0x1490c5);
    if ((in_stack_fffffffffffffe6f & 1) == 0) {
      local_1 = recoverFromError((OurReader *)
                                 CONCAT17(in_stack_fffffffffffffda7,
                                          CONCAT16(in_stack_fffffffffffffda6,
                                                   CONCAT15(in_stack_fffffffffffffda5,
                                                            in_stack_fffffffffffffda0))),
                                 (TokenType)((ulong)in_stack_fffffffffffffd98 >> 0x20));
      local_8c = 1;
      goto LAB_00149377;
    }
    in_stack_fffffffffffffda5 =
         readToken((OurReader *)
                   CONCAT17(in_stack_fffffffffffffd97,
                            CONCAT16(in_stack_fffffffffffffd96,
                                     CONCAT15(in_stack_fffffffffffffd95,in_stack_fffffffffffffd90)))
                   ,(Token *)in_stack_fffffffffffffd88);
    if ((!(bool)in_stack_fffffffffffffda5) ||
       (((in_stack_fffffffffffffe50 != 2 && (in_stack_fffffffffffffe50 != 10)) &&
        (in_stack_fffffffffffffe50 != 0xc)))) {
      paVar4 = &local_1d1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1d0,"Missing \',\' or \'}\' in object declaration",paVar4);
      local_1 = addErrorAndRecover((OurReader *)
                                   CONCAT17(in_stack_fffffffffffffd97,
                                            CONCAT16(in_stack_fffffffffffffd96,
                                                     CONCAT15(in_stack_fffffffffffffd95,
                                                              in_stack_fffffffffffffd90))),
                                   (string *)in_stack_fffffffffffffd88,
                                   (Token *)CONCAT17(in_stack_fffffffffffffd87,
                                                     in_stack_fffffffffffffd80),
                                   in_stack_fffffffffffffd7c);
      std::__cxx11::string::~string(local_1d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
      local_8c = 1;
      goto LAB_00149377;
    }
    local_1d2 = true;
    while( true ) {
      bVar1 = false;
      if (in_stack_fffffffffffffe50 == 0xc) {
        bVar1 = local_1d2;
      }
      if (bVar1 == false) break;
      in_stack_fffffffffffffd95 =
           readToken((OurReader *)
                     CONCAT17(in_stack_fffffffffffffd97,
                              CONCAT16(bVar1,CONCAT15(in_stack_fffffffffffffd95,
                                                      in_stack_fffffffffffffd90))),
                     (Token *)in_stack_fffffffffffffd88);
      local_1d2 = (bool)in_stack_fffffffffffffd95;
    }
    if (in_stack_fffffffffffffe50 == 2) {
      local_1 = 1;
      local_8c = 1;
      goto LAB_00149377;
    }
    in_stack_fffffffffffffd96 = 0;
  }
  message = (string *)local_1f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_1f9 + 1),"Missing \'}\' or object member name",(allocator *)message);
  local_1 = addErrorAndRecover((OurReader *)
                               CONCAT17(in_stack_fffffffffffffd97,
                                        CONCAT16(in_stack_fffffffffffffd96,
                                                 CONCAT15(in_stack_fffffffffffffd95,
                                                          in_stack_fffffffffffffd90))),message,
                               (Token *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80
                                                ),in_stack_fffffffffffffd7c);
  std::__cxx11::string::~string((string *)(local_1f9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1f9);
  local_8c = 1;
LAB_00149377:
  Value::~Value(in_stack_fffffffffffffdb0);
  std::__cxx11::string::~string(local_50);
  return (bool)(local_1 & 1);
}

Assistant:

bool OurReader::readObject(Token& tokenStart) {
  Token tokenName;
  std::string name;
  Value init(objectValue);
  currentValue().swapPayload(init);
  currentValue().setOffsetStart(tokenStart.start_ - begin_);
  while (readToken(tokenName)) {
    bool initialTokenOk = true;
    while (tokenName.type_ == tokenComment && initialTokenOk)
      initialTokenOk = readToken(tokenName);
    if (!initialTokenOk)
      break;
    if (tokenName.type_ == tokenObjectEnd && name.empty()) // empty object
      return true;
    name = "";
    if (tokenName.type_ == tokenString) {
      if (!decodeString(tokenName, name))
        return recoverFromError(tokenObjectEnd);
    } else if (tokenName.type_ == tokenNumber && features_.allowNumericKeys_) {
      Value numberName;
      if (!decodeNumber(tokenName, numberName))
        return recoverFromError(tokenObjectEnd);
      name = numberName.asString();
    } else {
      break;
    }

    Token colon;
    if (!readToken(colon) || colon.type_ != tokenMemberSeparator) {
      return addErrorAndRecover(
          "Missing ':' after object member name", colon, tokenObjectEnd);
    }
    if (name.length() >= (1U<<30)) throwRuntimeError("keylength >= 2^30");
    if (features_.rejectDupKeys_ && currentValue().isMember(name)) {
      std::string msg = "Duplicate key: '" + name + "'";
      return addErrorAndRecover(
          msg, tokenName, tokenObjectEnd);
    }
    Value& value = currentValue()[name];
    nodes_.push(&value);
    bool ok = readValue();
    nodes_.pop();
    if (!ok) // error already set
      return recoverFromError(tokenObjectEnd);

    Token comma;
    if (!readToken(comma) ||
        (comma.type_ != tokenObjectEnd && comma.type_ != tokenArraySeparator &&
         comma.type_ != tokenComment)) {
      return addErrorAndRecover(
          "Missing ',' or '}' in object declaration", comma, tokenObjectEnd);
    }
    bool finalizeTokenOk = true;
    while (comma.type_ == tokenComment && finalizeTokenOk)
      finalizeTokenOk = readToken(comma);
    if (comma.type_ == tokenObjectEnd)
      return true;
  }
  return addErrorAndRecover(
      "Missing '}' or object member name", tokenName, tokenObjectEnd);
}